

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O0

int XmlInitEncoding(INIT_ENCODING *p,ENCODING **encPtr,char *name)

{
  int iVar1;
  int i;
  char *name_local;
  ENCODING **encPtr_local;
  INIT_ENCODING *p_local;
  
  iVar1 = getEncodingIndex(name);
  if (iVar1 != -1) {
    (p->initEnc).isUtf16 = (char)iVar1;
    (p->initEnc).scanners[0] = initScanProlog;
    (p->initEnc).scanners[1] = initScanContent;
    (p->initEnc).updatePosition = initUpdatePosition;
    p->encPtr = encPtr;
    *encPtr = &p->initEnc;
  }
  p_local._4_4_ = (uint)(iVar1 != -1);
  return p_local._4_4_;
}

Assistant:

int
NS(XmlInitEncoding)(INIT_ENCODING *p, const ENCODING **encPtr,
                    const char *name)
{
  int i = getEncodingIndex(name);
  if (i == UNKNOWN_ENC)
    return 0;
  SET_INIT_ENC_INDEX(p, i);
  p->initEnc.scanners[XML_PROLOG_STATE] = NS(initScanProlog);
  p->initEnc.scanners[XML_CONTENT_STATE] = NS(initScanContent);
  p->initEnc.updatePosition = initUpdatePosition;
  p->encPtr = encPtr;
  *encPtr = &(p->initEnc);
  return 1;
}